

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
     ::save(BinaryBuffer *bb,Map *m)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::pair<const_diy::Direction,_int>_> *in_RDI;
  const_iterator it;
  size_t s;
  pair<const_diy::Direction,_int> *in_stack_ffffffffffffffc8;
  BinaryBuffer *in_stack_ffffffffffffffd0;
  _Rb_tree_const_iterator<std::pair<const_diy::Direction,_int>_> *this;
  _Self local_28;
  _Self local_20;
  size_type local_18;
  _Rb_tree_const_iterator<std::pair<const_diy::Direction,_int>_> *local_8;
  
  local_8 = in_RDI;
  local_18 = Catch::clara::std::
             map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
             ::size((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                     *)0x1af1f8);
  save<unsigned_long>(in_stack_ffffffffffffffd0,(unsigned_long *)in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       Catch::clara::std::
       map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
       ::begin((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                *)in_stack_ffffffffffffffc8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         Catch::clara::std::
         map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         ::end((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                *)in_stack_ffffffffffffffc8);
    bVar1 = Catch::clara::std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this = local_8;
    Catch::clara::std::_Rb_tree_const_iterator<std::pair<const_diy::Direction,_int>_>::operator*
              (local_8);
    save<std::pair<diy::Direction_const,int>>((BinaryBuffer *)this,in_stack_ffffffffffffffc8);
    Catch::clara::std::_Rb_tree_const_iterator<std::pair<const_diy::Direction,_int>_>::operator++
              (this);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Map& m)
    {
      size_t s = m.size();
      diy::save(bb, s);
      for (typename std::map<K,V>::const_iterator it = m.begin(); it != m.end(); ++it)
        diy::save(bb, *it);
    }